

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcS.c
# Opt level: O0

int Gia_ManCountRanks(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  bool bVar4;
  int local_40;
  int nSizePrev;
  int nSizeCurr;
  int iObj;
  int i;
  int t;
  Gia_Obj_t *pObj;
  Vec_Int_t *vCands;
  Vec_Int_t *vRanks;
  Vec_Int_t *vRoots;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p);
  p_00 = Vec_IntStartFull(iVar1);
  iVar1 = Gia_ManObjNum(p);
  p_01 = Vec_IntStart(iVar1);
  local_40 = 0;
  iVar1 = Gia_ManPoNum(p);
  if (iVar1 < 1) {
    __assert_fail("Gia_ManPoNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmcS.c"
                  ,0x14c,"int Gia_ManCountRanks(Gia_Man_t *)");
  }
  Gia_ManIncrementTravId(p);
  Gia_ObjSetTravIdCurrentId(p,0);
  p_02 = Vec_IntAlloc(100);
  nSizeCurr = 0;
  while( true ) {
    iVar1 = Gia_ManPoNum(p);
    bVar4 = false;
    if (nSizeCurr < iVar1) {
      _i = Gia_ManCo(p,nSizeCurr);
      bVar4 = _i != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    iVar1 = Gia_ObjFaninId0p(p,_i);
    Vec_IntPush(p_02,iVar1);
    nSizeCurr = nSizeCurr + 1;
  }
  iObj = 0;
  while (iVar1 = Vec_IntSize(p_02), local_40 < iVar1) {
    iVar1 = Vec_IntSize(p_02);
    for (nSizeCurr = local_40; nSizeCurr < iVar1; nSizeCurr = nSizeCurr + 1) {
      iVar2 = Vec_IntEntry(p_02,nSizeCurr);
      Gia_ManCountRanks_rec(p,iVar2,p_02,p_00,p_01,iObj);
    }
    iObj = iObj + 1;
    local_40 = iVar1;
  }
  Vec_IntWriteEntry(p_01,0,0);
  uVar3 = Vec_IntSum(p_01);
  iVar1 = Vec_IntSum(p_01);
  iVar2 = Gia_ManCandNum(p);
  printf("Tents = %6d.   Cands = %6d.  %10.2f %%\n",((double)iVar1 * 100.0) / (double)iVar2,
         (ulong)(uint)iObj,(ulong)uVar3);
  Vec_IntFree(p_02);
  Vec_IntFree(p_00);
  Vec_IntFree(p_01);
  return iObj;
}

Assistant:

int Gia_ManCountRanks( Gia_Man_t * p )
{
    Vec_Int_t * vRoots;
    Vec_Int_t * vRanks = Vec_IntStartFull( Gia_ManObjNum(p) );
    Vec_Int_t * vCands = Vec_IntStart( Gia_ManObjNum(p) );
    Gia_Obj_t * pObj;  
    int t, i, iObj, nSizeCurr = 0;
    assert( Gia_ManPoNum(p) > 0 );
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrentId( p, 0 );
    vRoots = Vec_IntAlloc( 100 );
    Gia_ManForEachPo( p, pObj, i )
        Vec_IntPush( vRoots, Gia_ObjFaninId0p(p, pObj) );
    for ( t = 0; nSizeCurr < Vec_IntSize(vRoots); t++ )
    {
        int nSizePrev = nSizeCurr;
        nSizeCurr = Vec_IntSize(vRoots);
        Vec_IntForEachEntryStartStop( vRoots, iObj, i, nSizePrev, nSizeCurr )
            Gia_ManCountRanks_rec( p, iObj, vRoots, vRanks, vCands, t );
    }
    Vec_IntWriteEntry( vCands, 0, 0 );
    printf( "Tents = %6d.   Cands = %6d.  %10.2f %%\n", t, Vec_IntSum(vCands), 100.0*Vec_IntSum(vCands)/Gia_ManCandNum(p) );
    Vec_IntFree( vRoots );
    Vec_IntFree( vRanks );
    Vec_IntFree( vCands );
    return t;
}